

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_crypto.c
# Opt level: O1

psa_status_t
psa_key_derivation_input_key
          (psa_key_derivation_operation_t *operation,psa_key_derivation_step_t step,
          psa_key_handle_t handle)

{
  psa_status_t pVar1;
  psa_key_slot_t *slot;
  psa_key_slot_t *local_20;
  
  pVar1 = psa_get_key_from_slot(handle,&local_20,0x1000,operation->alg);
  if (pVar1 != 0) {
    psa_key_derivation_abort(operation);
    return pVar1;
  }
  if (step == 0x101) {
    operation->field_0x4 = operation->field_0x4 | 1;
  }
  pVar1 = psa_key_derivation_input_internal
                    (operation,step,(local_20->attr).type,(local_20->data).raw.data,
                     (local_20->data).raw.bytes);
  return pVar1;
}

Assistant:

psa_status_t psa_key_derivation_input_key(
    psa_key_derivation_operation_t *operation,
    psa_key_derivation_step_t step,
    psa_key_handle_t handle )
{
    psa_key_slot_t *slot;
    psa_status_t status;

    status = psa_get_transparent_key( handle, &slot,
                                      PSA_KEY_USAGE_DERIVE,
                                      operation->alg );
    if( status != PSA_SUCCESS )
    {
        psa_key_derivation_abort( operation );
        return( status );
    }

    /* Passing a key object as a SECRET input unlocks the permission
     * to output to a key object. */
    if( step == PSA_KEY_DERIVATION_INPUT_SECRET )
        operation->can_output_key = 1;

    return( psa_key_derivation_input_internal( operation,
                                               step, slot->attr.type,
                                               slot->data.raw.data,
                                               slot->data.raw.bytes ) );
}